

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O0

bool google::ParseBuiltinType(State *state)

{
  bool bVar1;
  State *in_RDI;
  State copy;
  AbbrevPair *p;
  char *in_stack_ffffffffffffffb8;
  State *in_stack_ffffffffffffffc0;
  State *state_00;
  bool local_1;
  
  state_00 = (State *)&kBuiltinTypeList;
  while( true ) {
    if (state_00->mangled_cur == (char *)0x0) {
      memcpy(&stack0xffffffffffffffb8,in_RDI,0x30);
      bVar1 = ParseOneCharToken(in_RDI,'u');
      if ((bVar1) && (bVar1 = ParseSourceName(state_00), bVar1)) {
        local_1 = true;
      }
      else {
        memcpy(in_RDI,&stack0xffffffffffffffb8,0x30);
        local_1 = false;
      }
      return local_1;
    }
    if (*in_RDI->mangled_cur == *state_00->mangled_cur) break;
    state_00 = (State *)&state_00->out_begin;
  }
  MaybeAppend(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  in_RDI->mangled_cur = in_RDI->mangled_cur + 1;
  return true;
}

Assistant:

static bool ParseBuiltinType(State *state) {
  const AbbrevPair *p;
  for (p = kBuiltinTypeList; p->abbrev != NULL; ++p) {
    if (state->mangled_cur[0] == p->abbrev[0]) {
      MaybeAppend(state, p->real_name);
      ++state->mangled_cur;
      return true;
    }
  }

  State copy = *state;
  if (ParseOneCharToken(state, 'u') && ParseSourceName(state)) {
    return true;
  }
  *state = copy;
  return false;
}